

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::deinitTestRun
          (TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this,_run *run)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  _run *run_local;
  TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (run->fs_id != 0) {
    (**(code **)(lVar3 + 0x470))(run->fs_id);
    run->fs_id = 0;
  }
  if (run->fs_program_id != 0) {
    (**(code **)(lVar3 + 0x448))(run->fs_program_id);
    run->fs_program_id = 0;
  }
  if (run->pipeline_object_id != 0) {
    (**(code **)(lVar3 + 0x450))(1,&run->pipeline_object_id);
    run->pipeline_object_id = 0;
  }
  if (run->po_id != 0) {
    (**(code **)(lVar3 + 0x448))(run->po_id);
    run->po_id = 0;
  }
  if (run->tc_id != 0) {
    (**(code **)(lVar3 + 0x470))(run->tc_id);
    run->tc_id = 0;
  }
  if (run->tc_program_id != 0) {
    (**(code **)(lVar3 + 0x448))(run->tc_program_id);
    run->tc_program_id = 0;
  }
  if (run->te_id != 0) {
    (**(code **)(lVar3 + 0x470))(run->te_id);
    run->te_id = 0;
  }
  if (run->te_program_id != 0) {
    (**(code **)(lVar3 + 0x448))(run->te_program_id);
    run->te_program_id = 0;
  }
  if (run->vs_id != 0) {
    (**(code **)(lVar3 + 0x470))(run->vs_id);
    run->vs_id = 0;
  }
  if (run->vs_program_id != 0) {
    (**(code **)(lVar3 + 0x448))(run->vs_program_id);
    run->vs_program_id = 0;
  }
  return;
}

Assistant:

void TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::deinitTestRun(_run& run)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (run.fs_id != 0)
	{
		gl.deleteShader(run.fs_id);

		run.fs_id = 0;
	}

	if (run.fs_program_id != 0)
	{
		gl.deleteProgram(run.fs_program_id);

		run.fs_program_id = 0;
	}

	if (run.pipeline_object_id != 0)
	{
		gl.deleteProgramPipelines(1, &run.pipeline_object_id);

		run.pipeline_object_id = 0;
	}

	if (run.po_id != 0)
	{
		gl.deleteProgram(run.po_id);

		run.po_id = 0;
	}

	if (run.tc_id != 0)
	{
		gl.deleteShader(run.tc_id);

		run.tc_id = 0;
	}

	if (run.tc_program_id != 0)
	{
		gl.deleteProgram(run.tc_program_id);

		run.tc_program_id = 0;
	}

	if (run.te_id != 0)
	{
		gl.deleteShader(run.te_id);

		run.te_id = 0;
	}

	if (run.te_program_id != 0)
	{
		gl.deleteProgram(run.te_program_id);

		run.te_program_id = 0;
	}

	if (run.vs_id != 0)
	{
		gl.deleteShader(run.vs_id);

		run.vs_id = 0;
	}

	if (run.vs_program_id != 0)
	{
		gl.deleteProgram(run.vs_program_id);

		run.vs_program_id = 0;
	}
}